

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompatabilityTests.cpp
# Opt level: O3

void __thiscall
TEST_StandardCppLibrary_UniquePtrConversationToBool_Test::testBody
          (TEST_StandardCppLibrary_UniquePtrConversationToBool_Test *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,1,"CHECK_FALSE","aNull",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CompatabilityTests.cpp"
             ,0x11,pTVar2);
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,1,"CHECK_TRUE","notNull",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CompatabilityTests.cpp"
             ,0x14,pTVar2);
  return;
}

Assistant:

TEST(StandardCppLibrary, UniquePtrConversationToBool)
{
    auto const aNull = std::unique_ptr<int>(NULLPTR);
    CHECK_FALSE(aNull);

    auto const notNull = std::make_unique<int>(1);
    CHECK_TRUE(notNull);
}